

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

PreOrPostIncOrDec * __thiscall
soul::PoolAllocator::
allocate<soul::AST::PreOrPostIncOrDec,soul::AST::Context,soul::AST::Expression&,bool&,bool>
          (PoolAllocator *this,Context *args,Expression *args_1,bool *args_2,bool *args_3)

{
  bool bVar1;
  bool bVar2;
  SourceCodeText *pSVar3;
  Scope *pSVar4;
  PoolItem *pPVar5;
  
  pPVar5 = allocateSpaceForObject(this,0x40);
  bVar1 = *args_2;
  bVar2 = *args_3;
  *(undefined4 *)&pPVar5->field_0x18 = 0x1c;
  pSVar3 = (args->location).sourceCode.object;
  pPVar5[1].size = (size_t)pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pSVar4 = args->parentScope;
  pPVar5[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar5[1].item = pSVar4;
  *(undefined4 *)&pPVar5[1].field_0x18 = 0;
  pPVar5->item = &PTR__PreOrPostIncOrDec_002f6028;
  pPVar5[2].size = (size_t)args_1;
  *(bool *)&pPVar5[2].destructor = bVar1;
  *(bool *)((long)&pPVar5[2].destructor + 1) = bVar2;
  pPVar5->destructor =
       allocate<soul::AST::PreOrPostIncOrDec,_soul::AST::Context,_soul::AST::Expression_&,_bool_&,_bool>
       ::anon_class_1_0_00000001::__invoke;
  return (PreOrPostIncOrDec *)&pPVar5->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }